

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_request_body.c
# Opt level: O0

ngx_int_t ngx_http_read_discarded_request_body(ngx_http_request_t *r)

{
  ssize_t sVar1;
  ngx_int_t nVar2;
  size_t local_1090;
  u_char local_1088 [8];
  u_char buffer [4096];
  undefined1 local_80 [8];
  ngx_buf_t b;
  ngx_int_t rc;
  ssize_t n;
  size_t size;
  ngx_http_request_t *r_local;
  
  if ((r->connection->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,r->connection->log,0,"http read discarded body");
  }
  memset(local_80,0,0x50);
  b.shadow._0_2_ = (ushort)b.shadow & 0xfffe | 1;
  while( true ) {
    if ((r->headers_in).content_length_n == 0) {
      r->read_event_handler = ngx_http_block_reading;
      return 0;
    }
    if ((*(uint *)&r->connection->read->field_0x8 >> 5 & 1) == 0) {
      return -2;
    }
    if ((r->headers_in).content_length_n < 0x1001) {
      local_1090 = (r->headers_in).content_length_n;
    }
    else {
      local_1090 = 0x1000;
    }
    sVar1 = (*r->connection->recv)(r->connection,local_1088,local_1090);
    if (sVar1 == -1) {
      *(uint *)&r->connection->field_0xd8 =
           *(uint *)&r->connection->field_0xd8 & 0xffffefff | 0x1000;
      return 0;
    }
    if (sVar1 == -2) {
      return -2;
    }
    if (sVar1 == 0) break;
    local_80 = (undefined1  [8])local_1088;
    b.pos = local_1088 + sVar1;
    nVar2 = ngx_http_discard_request_body_filter(r,(ngx_buf_t *)local_80);
    if (nVar2 != 0) {
      return nVar2;
    }
    b._72_4_ = 0;
    b.num = 0;
  }
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_read_discarded_request_body(ngx_http_request_t *r)
{
    size_t     size;
    ssize_t    n;
    ngx_int_t  rc;
    ngx_buf_t  b;
    u_char     buffer[NGX_HTTP_DISCARD_BUFFER_SIZE];

    ngx_log_debug0(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "http read discarded body");

    ngx_memzero(&b, sizeof(ngx_buf_t));

    b.temporary = 1;

    for ( ;; ) {
        if (r->headers_in.content_length_n == 0) {
            r->read_event_handler = ngx_http_block_reading;
            return NGX_OK;
        }

        if (!r->connection->read->ready) {
            return NGX_AGAIN;
        }

        size = (size_t) ngx_min(r->headers_in.content_length_n,
                                NGX_HTTP_DISCARD_BUFFER_SIZE);

        n = r->connection->recv(r->connection, buffer, size);

        if (n == NGX_ERROR) {
            r->connection->error = 1;
            return NGX_OK;
        }

        if (n == NGX_AGAIN) {
            return NGX_AGAIN;
        }

        if (n == 0) {
            return NGX_OK;
        }

        b.pos = buffer;
        b.last = buffer + n;

        rc = ngx_http_discard_request_body_filter(r, &b);

        if (rc != NGX_OK) {
            return rc;
        }
    }
}